

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ISAType IVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  void *pvVar5;
  clock_t cVar6;
  clock_t cVar7;
  clock_t start;
  long lVar8;
  allocator local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out;
  
  bVar2 = parsePara(argc,argv);
  if (bVar2) {
    __stream = fopen(file_name,"r");
    iVar3 = -1;
    if (-1 < size) {
      iVar3 = size;
    }
    iVar4 = size / 4;
    if (size < -3) {
      iVar4 = -1;
    }
    for (lVar8 = 0; lVar8 != 0x7f8; lVar8 = lVar8 + 0x18) {
      pvVar5 = operator_new__((long)iVar3);
      *(void **)((long)result[0] + lVar8) = pvVar5;
      pvVar5 = operator_new__((long)iVar4);
      *(void **)((long)result[0] + lVar8 + 8) = pvVar5;
      pvVar5 = operator_new__((long)iVar4);
      *(void **)((long)result[0] + lVar8 + 0x10) = pvVar5;
    }
    fread(y,1,0x1fa400,__stream);
    fread(u,1,0x7e900,__stream);
    fread(v,1,0x7e900,__stream);
    fclose(__stream);
    IVar1 = isa;
    cVar6 = clock();
    if (IVar1 == BASIC) {
      BasicProcessor();
    }
    else if (IVar1 == MMX) {
      MMXProcessor();
    }
    else if (IVar1 == SSE2) {
      SSE2Processor();
    }
    else {
      AVXProcessor();
    }
    cVar7 = clock();
    printf("%s:\t%dms\n",ISAName[isa],(cVar7 - cVar6) / 1000 & 0xffffffff);
    std::__cxx11::string::string((string *)&local_2b0,file_name,&local_2b1);
    std::operator+(&local_290,&local_2b0,".");
    std::operator+(&local_270,&local_290,ISAName[isa]);
    std::operator+(&local_250,&local_270,".yuv");
    std::ofstream::ofstream(&out,(string *)&local_250,_S_out);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    for (lVar8 = 0; lVar8 != 0x7f8; lVar8 = lVar8 + 0x18) {
      std::ostream::write((char *)&out,*(long *)((long)result[0] + lVar8));
      std::ostream::write((char *)&out,*(long *)((long)result[0] + lVar8 + 8));
      std::ostream::write((char *)&out,*(long *)((long)result[0] + lVar8 + 0x10));
    }
    std::ofstream::close();
    for (lVar8 = 0; lVar8 != 0x7f8; lVar8 = lVar8 + 0x18) {
      operator_delete(*(void **)((long)result[0] + lVar8));
      operator_delete(*(void **)((long)result[0] + lVar8 + 8));
      operator_delete(*(void **)((long)result[0] + lVar8 + 0x10));
    }
    std::ofstream::~ofstream(&out);
    return 0;
  }
  printUsage();
  exit(-1);
}

Assistant:

int main(int argc, char *argv[]) {
    if (!parsePara(argc, argv)) {
        printUsage();
        exit(-1);
    }

    FILE *reader = fopen(file_name, "r");

    for (auto &i : result) {
        i[0] = new char[size];
        i[1] = new char[size / 4];
        i[2] = new char[size / 4];
    }

    fread(y, 1, width * height, reader);
    fread(u, 1, width / 2 * height / 2, reader);
    fread(v, 1, width / 2 * height / 2, reader);
    fclose(reader);

    int interval;
    if (isa == BASIC) {
        auto start = clock();
        BasicProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    } else if (isa == MMX) {
        auto start = clock();
        MMXProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    } else if (isa == SSE2) {
        auto start = clock();
        SSE2Processor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;

    } else {
        auto start = clock();
        AVXProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    }
    printf("%s:\t%dms\n", ISAName[isa], interval);

    std::ofstream out(std::string(file_name) + "." + ISAName[isa] + ".yuv");
    for (auto &i : result) {
        out.write(i[0], size);
        out.write(i[1], size / 4);
        out.write(i[2], size / 4);
    }
    out.close();

    for (auto &i : result) {
        delete i[0];
        delete i[1];
        delete i[2];
    }
}